

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

char * nng_stat_string(nng_stat *stat)

{
  nng_stat *stat_local;
  
  if (stat->s_info->si_type == NNG_STAT_STRING) {
    stat_local = (nng_stat *)(stat->s_val).sv_string;
  }
  else {
    stat_local = (nng_stat *)0x15a884;
  }
  return (char *)stat_local;
}

Assistant:

const char *
nng_stat_string(const nng_stat *stat)
{
#if NNG_ENABLE_STATS
	if (stat->s_info->si_type != NNG_STAT_STRING) {
		return ("");
	}
	return (stat->s_val.sv_string);
#else
	NNI_ARG_UNUSED(stat);
	return ("");
#endif
}